

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateImplMemberInit
          (MessageGenerator *this,Printer *p,InitType init_type)

{
  Options *desc;
  FieldGeneratorTable *this_00;
  pointer ppFVar1;
  FieldDescriptor *field;
  MaybeInitializedPtr MVar2;
  bool bVar3;
  ArenaDtorNeeds AVar4;
  FieldGenerator *this_01;
  value_type pOVar5;
  undefined8 extraout_RAX;
  Options *in_RCX;
  undefined8 uVar6;
  undefined1 split;
  char *in_R8;
  char *pcVar7;
  pointer ppFVar8;
  MemberInitSeparator separator;
  Iterator __begin4;
  bool dtor_on_demand;
  MaybeInitializedPtr local_178;
  MessageGenerator *local_170;
  InitType local_164;
  MemberInitSeparator local_160;
  anon_class_1_0_00000001 local_149;
  string local_148;
  undefined1 local_128 [32];
  undefined1 local_108 [24];
  code *local_f0;
  byte local_e8;
  _Alloc_hider local_e0;
  undefined1 local_d8 [24];
  bool local_c0;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_b8;
  HeapOrSoo local_70;
  string local_60;
  Iterator local_40;
  
  desc = &this->options_;
  local_178 = (MaybeInitializedPtr)p;
  local_170 = this;
  local_164 = init_type;
  SimpleBaseClass_abi_cxx11_((string *)local_128,(cpp *)this->descriptor_,(Descriptor *)desc,in_RCX)
  ;
  uVar6 = local_128._8_8_;
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,
                    CONCAT17(local_128[0x17],
                             CONCAT16(local_128[0x16],CONCAT24(local_128._20_2_,local_128._16_4_)))
                    + 1);
  }
  if (uVar6 != 0) {
    GenerateImplMemberInit((MessageGenerator *)local_128);
    __clang_call_terminate(extraout_RAX);
  }
  local_70.heap.control = (ctrl_t *)*(undefined8 *)((long)local_178.p + 0x58);
  *(ctrl_t **)((long)local_178.p + 0x68) =
       (ctrl_t *)((long)local_70.heap.control + *(long *)((long)local_178.p + 0x68));
  local_160.separators_ = false;
  local_70.heap.slot_array.p = local_178;
  local_160.printer_ = (Printer *)local_178;
  if ((local_164 != kConstexpr) && (0 < *(int *)(local_170->descriptor_ + 0x88))) {
    anon_unknown_0::MemberInitSeparator::operator()(&local_160);
    in_R8 = "_extensions_{visibility, arena}";
    google::protobuf::io::Printer::Emit(local_178.p,0,0,0x1f);
  }
  if ((local_170->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (local_170->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    AVar4 = NeedsArenaDestructor(local_170);
    local_40.idx = CONCAT31(local_40.idx._1_3_,AVar4 == kOnDemand);
    anon_unknown_0::MemberInitSeparator::operator()(&local_160);
    MVar2 = local_178;
    local_148.field_2._M_local_buf[4] = 'e';
    local_148.field_2._M_local_buf[5] = 's';
    local_148.field_2._M_local_buf[6] = '\0';
    local_128._0_8_ = local_128 + 0x10;
    local_128._16_4_ = 0x756c6176;
    local_128._20_2_ = 0x7365;
    local_128[0x16] = '\0';
    local_128[0x17] = local_148.field_2._M_local_buf[7];
    local_128[0x1f] = local_148.field_2._M_local_buf[0xf];
    local_128._8_8_ = 6;
    local_148._M_string_length = 0;
    local_148.field_2._M_allocated_capacity._0_4_ = 0x756c6100;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    local_108._0_8_ = operator_new(0x20);
    *(MessageGenerator **)local_108._0_8_ = local_170;
    *(MaybeInitializedPtr **)(local_108._0_8_ + 8) = &local_178;
    *(Iterator **)(local_108._0_8_ + 0x10) = &local_40;
    *(undefined1 *)(local_108._0_8_ + 0x18) = 0;
    local_f0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
    local_108._8_8_ = 0;
    local_108._16_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_e8 = 1;
    local_d8._0_8_ = 0;
    local_d8[8] = '\0';
    local_c0 = false;
    local_e0._M_p = local_d8 + 8;
    std::__cxx11::string::_M_replace((ulong)&local_e0,0,(char *)0x0,0x361ff2);
    local_b8._M_engaged = false;
    in_R8 = "_inlined_string_donated_{$values$}";
    google::protobuf::io::Printer::Emit(MVar2.p,local_128,1,0x22);
    if (local_b8._M_engaged == true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                (&local_b8);
    }
    if (local_e0._M_p != local_d8 + 8) {
      operator_delete(local_e0._M_p,CONCAT71(local_d8._9_7_,local_d8[8]) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_e8]._M_data)
              ((anon_class_1_0_00000001 *)&local_60,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)local_108);
    local_e8 = 0xff;
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,
                      CONCAT17(local_128[0x17],
                               CONCAT16(local_128[0x16],CONCAT24(local_128._20_2_,local_128._16_4_))
                              ) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,
                      CONCAT17(local_148.field_2._M_local_buf[7],
                               CONCAT16(local_148.field_2._M_local_buf[6],
                                        CONCAT15(local_148.field_2._M_local_buf[5],
                                                 CONCAT14(local_148.field_2._M_local_buf[4],
                                                          local_148.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
  }
  if ((local_170->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (local_170->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (local_164 == kArenaCopy) {
      anon_unknown_0::MemberInitSeparator::operator()(&local_160);
      google::protobuf::io::Printer::Emit(local_178.p,0,0,0x1b,"_has_bits_{from._has_bits_}");
    }
    anon_unknown_0::MemberInitSeparator::operator()(&local_160);
    in_R8 = "_cached_size_{0}";
    google::protobuf::io::Printer::Emit(local_178.p,0,0,0x10);
  }
  split = SUB81(in_R8,0);
  ppFVar8 = (local_170->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppFVar1 = (local_170->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar8 != ppFVar1) {
    this_00 = &local_170->field_generators_;
    do {
      field = *ppFVar8;
      bVar3 = ShouldSplit(field,desc);
      if (!bVar3) {
        this_01 = FieldGeneratorTable::get(this_00,field);
        if (local_164 == kArenaCopy) {
          if (((this_01->impl_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
               .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>.
              _M_head_impl)->has_trivial_value_ == false) {
            anon_unknown_0::MemberInitSeparator::operator()(&local_160);
            FieldGenerator::GenerateMemberCopyConstructor(this_01,(Printer *)local_178.p);
          }
        }
        else if (local_164 == kArena) {
          if (((this_01->impl_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
               .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>.
              _M_head_impl)->has_trivial_zero_default_ == false) {
            anon_unknown_0::MemberInitSeparator::operator()(&local_160);
            FieldGenerator::GenerateMemberConstructor(this_01,(Printer *)local_178.p);
          }
        }
        else if (local_164 == kConstexpr) {
          anon_unknown_0::MemberInitSeparator::operator()(&local_160);
          FieldGenerator::GenerateMemberConstexprConstructor(this_01,(Printer *)local_178.p);
        }
      }
      split = SUB81(in_R8,0);
      ppFVar8 = ppFVar8 + 1;
    } while (ppFVar8 != ppFVar1);
  }
  bVar3 = ShouldSplit(local_170->descriptor_,desc);
  if (bVar3) {
    anon_unknown_0::MemberInitSeparator::operator()(&local_160);
    MVar2 = local_178;
    local_148.field_2._M_allocated_capacity._0_4_ = 0x656d616e;
    local_148._M_string_length = 4;
    local_148.field_2._M_local_buf[4] = '\0';
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    DefaultInstanceName_abi_cxx11_
              (&local_60,(cpp *)local_170->descriptor_,(Descriptor *)desc,(Options *)0x1,(bool)split
              );
    io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_128,&local_148,&local_60);
    google::protobuf::io::Printer::Emit
              (MVar2.p,local_128,1,0x2e,"_split_{const_cast<Split*>(&$name$._instance)}");
    if (local_b8._M_engaged == true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                (&local_b8);
    }
    if (local_e0._M_p != local_d8 + 8) {
      operator_delete(local_e0._M_p,CONCAT71(local_d8._9_7_,local_d8[8]) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_e8]._M_data)
              ((anon_class_1_0_00000001 *)&local_40,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)local_108);
    local_e8 = 0xff;
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,
                      CONCAT17(local_128[0x17],
                               CONCAT16(local_128[0x16],CONCAT24(local_128._20_2_,local_128._16_4_))
                              ) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(EnforceOptimizeMode)local_60._M_dataplus._M_p)
        != &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_60._M_dataplus._M_p._4_4_,
                               (EnforceOptimizeMode)local_60._M_dataplus._M_p),
                      local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,
                      CONCAT17(local_148.field_2._M_local_buf[7],
                               CONCAT16(local_148.field_2._M_local_buf[6],
                                        CONCAT15(local_148.field_2._M_local_buf[5],
                                                 CONCAT14(local_148.field_2._M_local_buf[4],
                                                          local_148.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
  }
  local_60._M_string_length = (size_type)local_170->descriptor_;
  local_60._M_dataplus._M_p._0_4_ = kNoEnforcement;
  local_40.idx = *(int *)((long)&(((pointer)(local_60._M_string_length + 0x50))->tracker_vars_).
                                 super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 4);
  local_40.descriptor = (Descriptor *)local_60._M_string_length;
  bVar3 = cpp::operator==((Iterator *)&local_60,&local_40);
  if (!bVar3) {
    do {
      pOVar5 = OneOfRangeImpl::Iterator::operator*((Iterator *)&local_60);
      anon_unknown_0::MemberInitSeparator::operator()(&local_160);
      MVar2 = local_178;
      local_148.field_2._M_allocated_capacity._0_4_ = 0x656d616e;
      local_148._M_string_length = 4;
      local_148.field_2._M_local_buf[4] = '\0';
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      io::Printer::Sub::Sub<std::__cxx11::string_const&>
                ((Sub *)local_128,&local_148,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pOVar5 + 8)
                );
      google::protobuf::io::Printer::Emit(MVar2.p,(Sub *)local_128,1,9,"$name$_{}");
      if (local_b8._M_engaged == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  (&local_b8);
      }
      if (local_e0._M_p != local_d8 + 8) {
        operator_delete(local_e0._M_p,CONCAT71(local_d8._9_7_,local_d8[8]) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[local_e8]._M_data)
                (&local_149,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)local_108);
      local_e8 = 0xff;
      if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
        operator_delete((void *)local_128._0_8_,
                        CONCAT17(local_128[0x17],
                                 CONCAT16(local_128[0x16],
                                          CONCAT24(local_128._20_2_,local_128._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        CONCAT17(local_148.field_2._M_local_buf[7],
                                 CONCAT16(local_148.field_2._M_local_buf[6],
                                          CONCAT15(local_148.field_2._M_local_buf[5],
                                                   CONCAT14(local_148.field_2._M_local_buf[4],
                                                            local_148.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      local_60._M_dataplus._M_p._0_4_ = (EnforceOptimizeMode)local_60._M_dataplus._M_p + kSpeed;
      bVar3 = cpp::operator==((Iterator *)&local_60,&local_40);
    } while (!bVar3);
  }
  if ((local_170->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (local_170->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    anon_unknown_0::MemberInitSeparator::operator()(&local_160);
    google::protobuf::io::Printer::Emit(local_178.p,0,0,0x10,"_cached_size_{0}");
  }
  local_60._M_dataplus._M_p._0_4_ = *(EnforceOptimizeMode *)(local_170->descriptor_ + 0x7c);
  if ((EnforceOptimizeMode)local_60._M_dataplus._M_p == kNoEnforcement) {
LAB_00205688:
    if (local_164 == kConstexpr) goto LAB_002056d9;
  }
  else {
    anon_unknown_0::MemberInitSeparator::operator()(&local_160);
    MVar2 = local_178;
    if (local_164 != kArenaCopy) {
      google::protobuf::io::Printer::Emit(local_178.p,0,0,0xe,"_oneof_case_{}");
      goto LAB_00205688;
    }
    local_148.field_2._M_local_buf[4] = 's';
    local_148.field_2._M_local_buf[5] = '\0';
    local_128._0_8_ = local_128 + 0x10;
    local_128._16_4_ = 0x65736163;
    local_128._20_2_ = 0x73;
    local_128[0x16] = local_148.field_2._M_local_buf[6];
    local_128[0x17] = local_148.field_2._M_local_buf[7];
    local_128[0x1f] = local_148.field_2._M_local_buf[0xf];
    local_128._8_8_ = 5;
    local_148._M_string_length = 0;
    local_148.field_2._M_allocated_capacity._0_4_ = 0x65736100;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    local_108._0_8_ = operator_new(0x18);
    *(string **)local_108._0_8_ = &local_60;
    *(MaybeInitializedPtr **)(local_108._0_8_ + 8) = &local_178;
    *(undefined1 *)(local_108._0_8_ + 0x10) = 0;
    local_f0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
    local_108._8_8_ = 0;
    local_108._16_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_e8 = 1;
    local_d8._0_8_ = 0;
    local_d8[8] = '\0';
    local_c0 = false;
    local_e0._M_p = local_d8 + 8;
    std::__cxx11::string::_M_replace((ulong)&local_e0,0,(char *)0x0,0x361ff2);
    local_b8._M_engaged = false;
    google::protobuf::io::Printer::Emit(MVar2.p,local_128,1,0x15,"_oneof_case_{$cases$}");
    if (local_b8._M_engaged == true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                (&local_b8);
    }
    if (local_e0._M_p != local_d8 + 8) {
      operator_delete(local_e0._M_p,CONCAT71(local_d8._9_7_,local_d8[8]) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_e8]._M_data)
              ((anon_class_1_0_00000001 *)&local_40,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)local_108);
    local_e8 = 0xff;
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,
                      CONCAT17(local_128[0x17],
                               CONCAT16(local_128[0x16],CONCAT24(local_128._20_2_,local_128._16_4_))
                              ) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,
                      CONCAT17(local_148.field_2._M_local_buf[7],
                               CONCAT16(local_148.field_2._M_local_buf[6],
                                        CONCAT15(local_148.field_2._M_local_buf[5],
                                                 CONCAT14(local_148.field_2._M_local_buf[4],
                                                          local_148.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
  }
  if (local_170->num_weak_fields_ != 0) {
    anon_unknown_0::MemberInitSeparator::operator()(&local_160);
    uVar6 = 0x23;
    if (local_164 == kArenaCopy) {
      uVar6 = 0x3a;
    }
    pcVar7 = "_weak_field_map_{visibility, arena}";
    if (local_164 == kArenaCopy) {
      pcVar7 = "_weak_field_map_{visibility, arena, from._weak_field_map_}";
    }
    google::protobuf::io::Printer::Emit(local_178.p,0,0,uVar6,pcVar7);
  }
LAB_002056d9:
  if (local_160.separators_ == true) {
    google::protobuf::io::Printer::Outdent();
  }
  *(long *)((long)local_70.heap.slot_array + 0x68) =
       *(long *)((long)local_70.heap.slot_array + 0x68) - local_70._0_8_;
  return;
}

Assistant:

void MessageGenerator::GenerateImplMemberInit(io::Printer* p,
                                              InitType init_type) {
  ABSL_DCHECK(!HasSimpleBaseClass(descriptor_, options_));

  auto indent = p->WithIndent();
  MemberInitSeparator separator(p);

  auto init_extensions = [&] {
    if (descriptor_->extension_range_count() > 0 &&
        init_type != InitType::kConstexpr) {
      separator();
      p->Emit("_extensions_{visibility, arena}");
    }
  };

  auto init_inlined_string_indices = [&] {
    if (!inlined_string_indices_.empty()) {
      bool dtor_on_demand = NeedsArenaDestructor() == ArenaDtorNeeds::kOnDemand;
      auto values = [&] {
        for (size_t i = 0; i < InlinedStringDonatedSize(); ++i) {
          if (i > 0) {
            p->Emit(", ");
          }
          p->Emit(dtor_on_demand
                      ? "::_pbi::InitDonatingStates()"
                      : "::_pbi::InitDonatingStates() & 0xFFFFFFFEu");
        }
      };
      separator();
      p->Emit({{"values", values}}, "_inlined_string_donated_{$values$}");
    }
  };

  auto init_has_bits = [&] {
    if (!has_bit_indices_.empty()) {
      if (init_type == InitType::kArenaCopy) {
        separator();
        p->Emit("_has_bits_{from._has_bits_}");
      }
      separator();
      p->Emit("_cached_size_{0}");
    }
  };

  auto init_fields = [&] {
    for (auto* field : optimized_order_) {
      if (ShouldSplit(field, options_)) continue;

      auto const& generator = field_generators_.get(field);
      switch (init_type) {
        case InitType::kConstexpr:
          separator();
          generator.GenerateMemberConstexprConstructor(p);
          break;
        case InitType::kArena:
          if (!generator.has_trivial_zero_default()) {
            separator();
            generator.GenerateMemberConstructor(p);
          }
          break;
        case InitType::kArenaCopy:
          if (!generator.has_trivial_value()) {
            separator();
            generator.GenerateMemberCopyConstructor(p);
          }
          break;
      }
    }
  };

  auto init_split = [&] {
    if (ShouldSplit(descriptor_, options_)) {
      separator();
      p->Emit({{"name", DefaultInstanceName(descriptor_, options_, true)}},
              "_split_{const_cast<Split*>(&$name$._instance)}");
    }
  };

  auto init_oneofs = [&] {
    for (auto oneof : OneOfRange(descriptor_)) {
      separator();
      p->Emit({{"name", oneof->name()}}, "$name$_{}");
    }
  };

  auto init_cached_size_if_no_hasbits = [&] {
    if (has_bit_indices_.empty()) {
      separator();
      p->Emit("_cached_size_{0}");
    }
  };

  auto init_oneof_cases = [&] {
    if (int count = descriptor_->real_oneof_decl_count()) {
      separator();
      if (init_type == InitType::kArenaCopy) {
        auto cases = [&] {
          for (int i = 0; i < count; ++i) {
            p->Emit({{"index", i}, {"comma", i ? ", " : ""}},
                    "$comma$from._oneof_case_[$index$]");
          }
        };
        p->Emit({{"cases", cases}}, "_oneof_case_{$cases$}");
      } else {
        p->Emit("_oneof_case_{}");
      }
    }
  };

  auto init_weak_field_map = [&] {
    if (num_weak_fields_ && init_type != InitType::kConstexpr) {
      separator();
      if (init_type == InitType::kArenaCopy) {
        p->Emit("_weak_field_map_{visibility, arena, from._weak_field_map_}");
      } else {
        p->Emit("_weak_field_map_{visibility, arena}");
      }
    }
  };

  // Initialization order of the various fields inside `_impl_(...)`
  init_extensions();
  init_inlined_string_indices();
  init_has_bits();
  init_fields();
  init_split();
  init_oneofs();
  init_cached_size_if_no_hasbits();
  init_oneof_cases();
  init_weak_field_map();
}